

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

void __thiscall Centaurus::CharClass<wchar_t>::append(CharClass<wchar_t> *this,Range<wchar_t> *r)

{
  Range<wchar_t> *__last;
  Range<wchar_t> *__first;
  wchar_t wVar1;
  size_type __n;
  pointer pRVar2;
  Range<wchar_t> *pRVar3;
  Range<wchar_t> *pRVar4;
  vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *this_00;
  
  pRVar2 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->m_ranges;
  if (((this->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_start != pRVar2) && (pRVar2[-1].m_end == r->m_start)) {
    pRVar2[-1].m_end = r->m_end;
    return;
  }
  pRVar4 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar4 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pRVar4->_vptr_Range = (_func_int **)&PTR__Range_0019f5b0;
    wVar1 = r->m_end;
    pRVar4->m_start = r->m_start;
    pRVar4->m_end = wVar1;
    (this->m_ranges).
    super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pRVar4 + 1;
    return;
  }
  __n = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
        _M_check_len(this_00,1,"vector::_M_realloc_insert");
  __last = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __first = (this_00->
            super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = std::_Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ::_M_allocate(&this_00->
                          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                         ,__n);
  *(undefined ***)((long)pRVar2 + ((long)pRVar4 - (long)__first)) = &PTR__Range_0019f5b0;
  *(undefined8 *)((long)pRVar2 + ((long)pRVar4 - (long)__first) + 8) = *(undefined8 *)&r->m_start;
  pRVar3 = std::__uninitialized_copy<false>::
           __uninit_copy<Centaurus::Range<wchar_t>const*,Centaurus::Range<wchar_t>*>
                     (__first,pRVar4,pRVar2);
  pRVar4 = std::__uninitialized_copy<false>::
           __uninit_copy<Centaurus::Range<wchar_t>const*,Centaurus::Range<wchar_t>*>
                     (pRVar4,__last,pRVar3 + 1);
  std::_Destroy_aux<false>::__destroy<Centaurus::Range<wchar_t>*>(__first,__last);
  if (__first != (Range<wchar_t> *)0x0) {
    operator_delete(__first);
  }
  (this_00->
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>).
  _M_impl.super__Vector_impl_data._M_start = pRVar2;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = pRVar4;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = pRVar2 + __n;
  return;
}

Assistant:

void append(const Range<TCHAR>& r)
    {
        if (m_ranges.empty())
        {
            m_ranges.push_back(r);
        }
        else
        {
            if (m_ranges.back().end() == r.start())
            {
                m_ranges.back().end(r.end());
            }
            else
            {
                m_ranges.push_back(r);
            }
        }
    }